

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O2

mbedtls_pk_type_t mbedtls_ssl_get_ciphersuite_sig_pk_alg(mbedtls_ssl_ciphersuite_t *info)

{
  mbedtls_pk_type_t mVar1;
  byte bVar2;
  
  bVar2 = info->key_exchange - 1;
  mVar1 = MBEDTLS_PK_NONE;
  if (bVar2 < 10) {
    mVar1 = (&DAT_001f5d1c)[bVar2];
  }
  return mVar1;
}

Assistant:

mbedtls_pk_type_t mbedtls_ssl_get_ciphersuite_sig_pk_alg(const mbedtls_ssl_ciphersuite_t *info)
{
    switch (info->key_exchange) {
        case MBEDTLS_KEY_EXCHANGE_RSA:
        case MBEDTLS_KEY_EXCHANGE_DHE_RSA:
        case MBEDTLS_KEY_EXCHANGE_ECDHE_RSA:
        case MBEDTLS_KEY_EXCHANGE_RSA_PSK:
            return MBEDTLS_PK_RSA;

        case MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA:
            return MBEDTLS_PK_ECDSA;

        case MBEDTLS_KEY_EXCHANGE_ECDH_RSA:
        case MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA:
            return MBEDTLS_PK_ECKEY;

        default:
            return MBEDTLS_PK_NONE;
    }
}